

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

BCReg expr_toanyreg(FuncState *fs,ExpDesc *e)

{
  uint reg;
  
  expr_discharge(fs,e);
  if (e->k == VNONRELOC) {
    if (e->t == e->f) goto LAB_00122539;
    reg = (e->u).s.info;
    if (fs->nactvar <= reg) {
      expr_toreg(fs,e,reg);
      goto LAB_00122539;
    }
  }
  expr_tonextreg(fs,e);
LAB_00122539:
  return (e->u).s.info;
}

Assistant:

static BCReg expr_toanyreg(FuncState *fs, ExpDesc *e)
{
  expr_discharge(fs, e);
  if (e->k == VNONRELOC) {
    if (!expr_hasjump(e)) return e->u.s.info;  /* Already in a register. */
    if (e->u.s.info >= fs->nactvar) {
      expr_toreg(fs, e, e->u.s.info);  /* Discharge to temp. register. */
      return e->u.s.info;
    }
  }
  expr_tonextreg(fs, e);  /* Discharge to next register. */
  return e->u.s.info;
}